

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O2

void Gia_ManDupCollapse_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Gia_Man_t *pNew)

{
  int *piVar1;
  int iVar2;
  int iLit1;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  
  iVar2 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar2 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (((uint)*(undefined8 *)pObj & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                    ,0x2ea,"void Gia_ManDupCollapse_rec(Gia_Man_t *, Gia_Obj_t *, Gia_Man_t *)");
    }
    iVar2 = Gia_ObjId(p,pObj);
    if ((p->pSibls != (int *)0x0) && (p->pSibls[iVar2] != 0)) {
      iVar2 = Gia_ObjId(p,pObj);
      pGVar4 = Gia_ObjSiblObj(p,iVar2);
      Gia_ManDupCollapse_rec(p,pGVar4,pNew);
    }
    Gia_ManDupCollapse_rec(p,pObj + -(*(ulong *)pObj & 0x1fffffff),pNew);
    Gia_ManDupCollapse_rec(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),pNew);
    iVar2 = Gia_ObjFanin0Copy(pObj);
    iLit1 = Gia_ObjFanin1Copy(pObj);
    uVar3 = Gia_ManHashAnd(pNew,iVar2,iLit1);
    pObj->Value = uVar3;
    iVar2 = Gia_ObjId(p,pObj);
    if ((p->pSibls != (int *)0x0) && (p->pSibls[iVar2] != 0)) {
      iVar2 = Gia_ObjId(p,pObj);
      pGVar4 = Gia_ObjSiblObj(p,iVar2);
      iVar2 = Abc_Lit2Var(pGVar4->Value);
      piVar1 = pNew->pSibls;
      uVar3 = Abc_Lit2Var(pObj->Value);
      piVar1[uVar3] = iVar2;
    }
  }
  return;
}

Assistant:

void Gia_ManDupCollapse_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Gia_Man_t * pNew )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    assert( Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
        Gia_ManDupCollapse_rec( p, Gia_ObjSiblObj(p, Gia_ObjId(p, pObj)), pNew );
    Gia_ManDupCollapse_rec( p, Gia_ObjFanin0(pObj), pNew );
    Gia_ManDupCollapse_rec( p, Gia_ObjFanin1(pObj), pNew );
//    assert( !~pObj->Value );
    pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
        pNew->pSibls[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var(Gia_ObjSiblObj(p, Gia_ObjId(p, pObj))->Value);        
}